

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_58a0d::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::gemm4xN<3>
          (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  float *pfVar1;
  float *pfVar2;
  block_q8_0 *pbVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  long lVar9;
  long lVar10;
  block_q5_0 *pbVar11;
  undefined1 *puVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  block_q5_0 *pbVar16;
  long lVar17;
  long lVar18;
  int8_t *piVar19;
  block_q5_0 *pbVar20;
  block_q5_0 *pbVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 in_ZMM3 [64];
  __m128i x;
  __m128i x_1;
  undefined1 auVar34 [16];
  __m128i x_2;
  __m128i x_3;
  undefined1 auVar35 [32];
  undefined4 uVar36;
  undefined1 auVar37 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM18 [64];
  __m256 Cv [3] [4];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  lVar13 = m - m0;
  lVar9 = lVar13 + 3;
  if (-1 < lVar13) {
    lVar9 = lVar13;
  }
  lVar13 = (n - n0) / 3;
  lVar18 = (lVar9 >> 2) * lVar13;
  lVar9 = (lVar18 + -1 + (long)this->nth) / (long)this->nth;
  lVar14 = this->ith * lVar9;
  lVar9 = lVar9 + lVar14;
  if (lVar18 <= lVar9) {
    lVar9 = lVar18;
  }
  if (lVar14 < lVar9) {
    pbVar16 = this->A;
    lVar18 = this->lda;
    auVar25 = vmovdqa64_avx512vl(_DAT_0016a9c0);
    auVar32._8_8_ = 0x7fbfdfeff7fbfdfe;
    auVar32._0_8_ = 0x7fbfdfeff7fbfdfe;
    auVar32._16_8_ = 0x7fbfdfeff7fbfdfe;
    auVar32._24_8_ = 0x7fbfdfeff7fbfdfe;
    auVar31._8_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar31._0_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar31._16_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar31._24_8_ = 0xf0f0f0f0f0f0f0f0;
    pbVar3 = this->B;
    lVar4 = this->ldc;
    lVar5 = this->k;
    auVar22 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
    local_c0 = ZEXT1664(auVar22);
    auVar30 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    lVar6 = this->ldb;
    pfVar7 = this->C;
    do {
      local_100 = local_c0;
      local_140 = local_c0;
      local_180 = local_c0;
      local_1c0 = local_c0;
      local_200 = local_c0;
      lVar10 = (lVar14 % lVar13) * 3 + n0;
      if (0 < lVar5) {
        lVar9 = m0 + (lVar14 / lVar13) * 4;
        pbVar21 = pbVar16 + (lVar9 + 3) * lVar18;
        pbVar11 = pbVar16 + (lVar9 + 2) * lVar18;
        pbVar20 = pbVar16 + (lVar9 + 1) * lVar18;
        pbVar16 = pbVar16 + lVar9 * lVar18;
        piVar19 = pbVar3->qs + lVar6 * 0x22 * lVar10;
        auVar24 = vpinsrw_avx(ZEXT216(pbVar16->d),(uint)pbVar20->d,1);
        auVar34 = vpsrlw_avx(*(undefined1 (*) [16])pbVar16->qs,4);
        auVar27._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * *(undefined1 (*) [16])pbVar16->qs;
        auVar27._16_16_ = ZEXT116(1) * auVar34;
        auVar24 = vpinsrw_avx(auVar24,(uint)pbVar11->d,2);
        auVar24 = vpinsrw_avx(auVar24,(uint)pbVar21->d,3);
        auVar26 = vpermb_avx512vl(auVar25,ZEXT432(*(uint *)pbVar16->qh));
        auVar26 = vpor_avx2(auVar26,auVar32);
        auVar24 = vcvtph2ps_f16c(auVar24);
        auVar26 = vpcmpeqb_avx2(auVar26,auVar30);
        auVar26 = vpternlogq_avx512vl(auVar26,auVar26,auVar26,0xf);
        auVar27 = vpternlogq_avx512vl(auVar26,auVar31,auVar27,0xe2);
        auVar34 = vpsrlw_avx(*(undefined1 (*) [16])pbVar20->qs,4);
        auVar28._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * *(undefined1 (*) [16])pbVar20->qs;
        auVar28._16_16_ = ZEXT116(1) * auVar34;
        auVar26 = vpermb_avx512vl(auVar25,ZEXT432(*(uint *)pbVar20->qh));
        auVar26 = vpor_avx2(auVar26,auVar32);
        auVar26 = vpcmpeqb_avx2(auVar26,auVar30);
        auVar26 = vpternlogq_avx512vl(auVar26,auVar26,auVar26,0xf);
        auVar28 = vpternlogq_avx512vl(auVar26,auVar31,auVar28,0xe2);
        auVar33 = vpsignb_avx2(auVar28,auVar28);
        auVar34 = vpsrlw_avx(*(undefined1 (*) [16])pbVar11->qs,4);
        auVar29._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * *(undefined1 (*) [16])pbVar11->qs;
        auVar29._16_16_ = ZEXT116(1) * auVar34;
        auVar26 = vpermb_avx512vl(auVar25,ZEXT432(*(uint *)pbVar11->qh));
        auVar26 = vpor_avx2(auVar26,auVar32);
        auVar26 = vpcmpeqb_avx2(auVar26,auVar30);
        auVar26 = vpternlogq_avx512vl(auVar26,auVar26,auVar26,0xf);
        auVar29 = vpternlogq_avx512vl(auVar26,auVar31,auVar29,0xe2);
        auVar26 = vpsignb_avx2(auVar29,auVar29);
        auVar34 = vpsrlw_avx(*(undefined1 (*) [16])pbVar21->qs,4);
        auVar35._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * *(undefined1 (*) [16])pbVar21->qs;
        auVar35._16_16_ = ZEXT116(1) * auVar34;
        auVar25 = vpermb_avx512vl(auVar25,ZEXT432(*(uint *)pbVar21->qh));
        auVar25 = vpor_avx2(auVar25,auVar32);
        auVar30 = vpcmpeqb_avx2(auVar25,auVar30);
        auVar30 = vpternlogq_avx512vl(auVar30,auVar30,auVar30,0xf);
        auVar31 = vpternlogq_avx512vl(auVar30,auVar31,auVar35,0xe2);
        auVar25 = vpsignb_avx2(auVar27,auVar27);
        vpsignb_avx2(auVar31,auVar31);
        auVar30 = *(undefined1 (*) [32])piVar19;
        auVar34 = vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        uVar36 = *(undefined4 *)(&ggml_table_f32_f16 + (ulong)((block_q8_0 *)(piVar19 + -2))->d * 4)
        ;
        auVar8._4_4_ = uVar36;
        auVar8._0_4_ = uVar36;
        auVar8._8_4_ = uVar36;
        auVar8._12_4_ = uVar36;
        auVar23 = vmulps_avx512vl(auVar24,auVar8);
        auVar32 = vpsignb_avx2(auVar30,auVar27);
        auVar25 = vpdpbusd_avx512_vnni(ZEXT1632(auVar34),auVar25,auVar32);
        auVar32 = vcvtdq2ps_avx512vl(auVar25);
        auVar24 = vpxord_avx512vl(auVar25._0_16_,auVar25._0_16_);
        uVar36 = auVar23._0_4_;
        auVar37._4_4_ = uVar36;
        auVar37._0_4_ = uVar36;
        auVar37._8_4_ = uVar36;
        auVar37._12_4_ = uVar36;
        auVar37._16_4_ = uVar36;
        auVar37._20_4_ = uVar36;
        auVar37._24_4_ = uVar36;
        auVar37._28_4_ = uVar36;
        local_200._0_32_ = ZEXT1632(auVar22);
        vfmadd213ps_fma(auVar32,auVar37,local_200._0_32_);
        auVar25 = vpsignb_avx2(auVar30,auVar28);
        auVar25 = vpdpbusd_avx512_vnni(ZEXT1632(auVar24),auVar33,auVar25);
        auVar32 = vcvtdq2ps_avx512vl(auVar25);
        auVar34 = vpxord_avx512vl(auVar25._0_16_,auVar25._0_16_);
        auVar24 = vmovshdup_avx(auVar23);
        auVar25._0_8_ = auVar24._0_8_;
        auVar25._8_8_ = auVar25._0_8_;
        auVar25._16_8_ = auVar25._0_8_;
        auVar25._24_8_ = auVar25._0_8_;
        vfmadd213ps_fma(auVar32,auVar25,(undefined1  [32])0x0);
        auVar24 = vshufps_avx(auVar23,auVar23,0xaa);
        auVar33._0_8_ = auVar24._0_8_;
        auVar33._8_8_ = auVar33._0_8_;
        auVar33._16_8_ = auVar33._0_8_;
        auVar33._24_8_ = auVar33._0_8_;
        auVar25 = vpsignb_avx2(auVar30,auVar29);
        vpsignb_avx2(auVar30,auVar31);
        auVar30 = vpdpbusd_avx512_vnni(ZEXT1632(auVar34),auVar26,auVar25);
        auVar30 = vcvtdq2ps_avx512vl(auVar30);
        local_1c0._0_32_ = ZEXT1632(auVar22);
        vfmadd213ps_fma(auVar30,auVar33,local_1c0._0_32_);
        vshufps_avx(auVar23,auVar23,0xff);
        halt_baddata();
      }
      lVar15 = 0;
      lVar10 = (long)pfVar7 + (lVar14 / lVar13) * 0x10 + lVar10 * lVar4 * 4 + m0 * 4;
      puVar12 = local_200;
      do {
        lVar17 = 0;
        do {
          pfVar2 = (float *)(puVar12 + lVar17 * 8 + 0x10);
          pfVar1 = (float *)(puVar12 + lVar17 * 8);
          auVar34._0_4_ = *pfVar2 + *pfVar1;
          auVar34._4_4_ = pfVar2[1] + pfVar1[1];
          auVar34._8_4_ = pfVar2[2] + pfVar1[2];
          auVar34._12_4_ = pfVar2[3] + pfVar1[3];
          auVar24 = vshufpd_avx(auVar34,auVar34,1);
          auVar23._0_4_ = auVar34._0_4_ + auVar24._0_4_;
          auVar23._4_4_ = auVar34._4_4_ + auVar24._4_4_;
          auVar23._8_4_ = auVar34._8_4_ + auVar24._8_4_;
          auVar23._12_4_ = auVar34._12_4_ + auVar24._12_4_;
          auVar24 = vhaddps_avx(auVar23,auVar23);
          *(int *)(lVar10 + lVar17) = auVar24._0_4_;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x10);
        lVar15 = lVar15 + 1;
        puVar12 = puVar12 + 0x80;
        lVar10 = lVar10 + lVar4 * 4;
      } while (lVar15 != 3);
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar9);
  }
  return;
}

Assistant:

NOINLINE void gemm4xN(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / 4;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * 4;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][4] = {};
            for (int64_t l = 0; l < k; ++l) {
                uint64_t a_delta = ((uint64_t)A[lda * (ii + 3) + l].d << 48) | ((uint64_t)A[lda * (ii + 2) + l].d << 32) | ((uint64_t)A[lda * (ii + 1) + l].d << 16) | (A[lda * (ii + 0) + l].d);
                // Convert delta values for four blocks to float values
                __m128 da = _mm_cvtph_ps(_mm_set_epi64x(0, a_delta));
                __m256i avec0 = load(A + lda * (ii + 0) + l);
                __m256i avec1 = load(A + lda * (ii + 1) + l);
                __m256i avec2 = load(A + lda * (ii + 2) + l);
                __m256i avec3 = load(A + lda * (ii + 3) + l);
                for (int64_t j = 0; j < RN; ++j) {
                        __m128 db = _mm_set1_ps(unhalf(B[ldb * (jj + j) + l].d));
                        // Computation of product of delta values for four blocks and replicate it across 256 bit lane
                        __m256 dvec =  _mm256_castps128_ps256(_mm_mul_ps(da, db));
                        dvec = _mm256_permute2f128_ps(dvec ,dvec, 0);
                        // Computation of dot product and multiplication with appropriate delta value products
                        Cv[j][0] = madd(_mm256_shuffle_ps(dvec, dvec, 0),
                                    updot(_mm256_sign_epi8(avec0, avec0),
                                          _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec0)),
                                    Cv[j][0]);
                        Cv[j][1] = madd(_mm256_shuffle_ps(dvec, dvec, 85),
                                    updot(_mm256_sign_epi8(avec1, avec1),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec1)),
                                    Cv[j][1]);
                        Cv[j][2] = madd(_mm256_shuffle_ps(dvec, dvec, 170),
                                    updot(_mm256_sign_epi8(avec2, avec2),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec2)),
                                    Cv[j][2]);
                        Cv[j][3] = madd(_mm256_shuffle_ps(dvec, dvec, 255),
                                    updot(_mm256_sign_epi8(avec3, avec3),
                                            _mm256_sign_epi8(load(B + ldb * (jj + j) + l), avec3)),
                                    Cv[j][3]);
                }
            }

            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < 4; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }